

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function_test.cpp
# Opt level: O1

void __thiscall
reflect_function_test_DefaultConstructor_Test::TestBody
          (reflect_function_test_DefaultConstructor_Test *this)

{
  AssertHelper *pAVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  void *pvVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  AssertHelperData *pAVar12;
  int i;
  example_arg_type e;
  AssertionResult gtest_ar;
  char c;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  char acStack_70 [24];
  undefined1 *local_58;
  AssertHelper *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *local_48;
  undefined1 local_31;
  
  local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_80.data_._0_4_ = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_78,(int *)&local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (AssertHelper *)0x0) {
      pAVar12 = (AssertHelperData *)0x13a3e1;
    }
    else {
      pAVar12 = local_50->data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x7e,(char *)pAVar12);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  pAVar1 = local_50;
  if (local_50 != (AssertHelper *)0x0) {
    if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
      operator_delete(local_50->data_);
    }
    operator_delete(pAVar1);
  }
  pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           type_create(1,"char",0,0);
  pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           type_create(3,"int",0,0);
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           type_create(0xb,"ptr",0,0);
  local_80.data_ = (AssertHelperData *)0x0;
  local_78._M_head_impl = pbVar7;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((internal *)&local_58,"(type)char_type","(type)__null",(type_type **)&local_78,
             (type_type **)&local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (AssertHelper *)0x0) {
      pAVar12 = (AssertHelperData *)0x13a3e1;
    }
    else {
      pAVar12 = local_50->data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x84,(char *)pAVar12);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  pAVar1 = local_50;
  if (local_50 != (AssertHelper *)0x0) {
    if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
      operator_delete(local_50->data_);
    }
    operator_delete(pAVar1);
  }
  local_80.data_ = (AssertHelperData *)0x0;
  local_78._M_head_impl = pbVar8;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((internal *)&local_58,"(type)int_type","(type)__null",(type_type **)&local_78,
             (type_type **)&local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (AssertHelper *)0x0) {
      pAVar12 = (AssertHelperData *)0x13a3e1;
    }
    else {
      pAVar12 = local_50->data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x85,(char *)pAVar12);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  pAVar1 = local_50;
  if (local_50 != (AssertHelper *)0x0) {
    if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
      operator_delete(local_50->data_);
    }
    operator_delete(pAVar1);
  }
  local_80.data_ = (AssertHelperData *)0x0;
  local_78._M_head_impl = pbVar9;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            ((internal *)&local_58,"(type)ptr_type","(type)__null",(type_type **)&local_78,
             (type_type **)&local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (AssertHelper *)0x0) {
      pAVar12 = (AssertHelperData *)0x13a3e1;
    }
    else {
      pAVar12 = local_50->data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x86,(char *)pAVar12);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  pAVar1 = local_50;
  if (local_50 != (AssertHelper *)0x0) {
    if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
      operator_delete(local_50->data_);
    }
    operator_delete(pAVar1);
  }
  if (pbVar9 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
      (pbVar8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
      pbVar7 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    pvVar10 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example",3,pvVar10,function_example_singleton);
    local_80.data_ = (AssertHelperData *)0x0;
    local_78._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              ((internal *)&local_58,"(function)f","(function)__null",(function_type **)&local_78,
               (function_type **)&local_80);
    if (local_58._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (local_50 == (AssertHelper *)0x0) {
        pAVar12 = (AssertHelperData *)0x13a3e1;
      }
      else {
        pAVar12 = local_50->data_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
                 ,0x90,(char *)pAVar12);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    pAVar1 = local_50;
    if (local_50 != (AssertHelper *)0x0) {
      if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
        operator_delete(local_50->data_);
      }
      operator_delete(pAVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar2 = function_increment_reference(pbVar11);
      local_78._M_head_impl._0_4_ = uVar2;
      local_80.data_ = local_80.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"(int)function_increment_reference(f)","(int)0",
                 (int *)&local_78,(int *)&local_80);
      if (local_58._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_50 == (AssertHelper *)0x0) {
          pAVar12 = (AssertHelperData *)0x13a3e1;
        }
        else {
          pAVar12 = local_50->data_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
                   ,0x94,(char *)pAVar12);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      if (local_50 != (AssertHelper *)0x0) {
        if (local_50->data_ != (AssertHelperData *)(local_50 + 2)) {
          operator_delete(local_50->data_);
        }
        operator_delete(local_50);
      }
      uVar3 = function_signature(pbVar11);
      signature_set(uVar3,0,"c",pbVar7);
      uVar3 = function_signature(pbVar11);
      signature_set(uVar3,1,"i",pbVar8);
      uVar3 = function_signature(pbVar11);
      signature_set(uVar3,2,"p",pbVar9);
      local_58 = &local_31;
      local_31 = 0x6d;
      local_80.data_._0_4_ = 0x75bcd15;
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x4053333300000005;
      builtin_strncpy(acStack_70,"ABCDEFGHI",10);
      acStack_70[10] = '\0';
      acStack_70[0xb] = '\0';
      local_48 = &local_78;
      local_50 = &local_80;
      function_call(pbVar11,&local_58,3);
      function_destroy(pbVar11);
    }
    type_destroy(pbVar7);
    type_destroy(pbVar8);
    type_destroy(pbVar9);
  }
  return;
}

Assistant:

TEST_F(reflect_function_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type ptr_type = type_create(TYPE_PTR, "ptr", NULL, NULL);

	EXPECT_NE((type)char_type, (type)NULL);
	EXPECT_NE((type)int_type, (type)NULL);
	EXPECT_NE((type)ptr_type, (type)NULL);

	if (char_type != NULL && int_type != NULL && ptr_type != NULL)
	{
		function f;

		function_impl_example example_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f = function_create("example", 3, example_impl, &function_example_singleton);

		EXPECT_NE((function)f, (function)NULL);

		if (f != NULL)
		{
			EXPECT_EQ((int)function_increment_reference(f), (int)0);

			signature_set(function_signature(f), 0, "c", char_type);
			signature_set(function_signature(f), 1, "i", int_type);
			signature_set(function_signature(f), 2, "p", ptr_type);

			/* function call example */
			{
				char c = 'm';
				int i = 123456789;
				struct example_arg_type e = { 5, 3.3f, "ABCDEFGHI" };

				function_args args = { &c, &i, &e };

				function_call(f, args, sizeof(args) / sizeof(args[0]));
			}

			function_destroy(f);
		}

		type_destroy(char_type);
		type_destroy(int_type);
		type_destroy(ptr_type);
	}
}